

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

int ImTextStrToUtf8(char *buf,int buf_size,ImWchar *in_text,ImWchar *in_text_end)

{
  ushort uVar1;
  int iVar2;
  char *buf_out;
  byte *pbVar3;
  int iVar4;
  long lVar5;
  long lVar6;
  
  iVar2 = (int)buf;
  pbVar3 = (byte *)(buf + (long)buf_size + -1);
  if (buf < pbVar3) {
    do {
      if ((in_text_end <= in_text && in_text_end != (ImWchar *)0x0) ||
         (uVar1 = *in_text, uVar1 == 0)) break;
      if (uVar1 < 0x80) {
        *buf = (byte)uVar1;
        buf = (char *)((byte *)buf + 1);
      }
      else {
        iVar4 = ~(uint)buf + buf_size + iVar2;
        if (uVar1 < 0x800) {
          if (1 < iVar4) {
            *buf = (byte)(uVar1 >> 6) | 0xc0;
            lVar5 = 2;
            lVar6 = 1;
            goto LAB_00136341;
          }
LAB_0013630f:
          lVar5 = 0;
        }
        else {
          if ((uVar1 & 0xfc00) == 0xdc00) goto LAB_0013630f;
          if ((uVar1 & 0xfc00) == 0xd800) {
            if (iVar4 < 4) goto LAB_0013630f;
            ((byte *)buf)[0] = 0xf0;
            ((byte *)buf)[1] = 0x8d;
            ((byte *)buf)[2] = (byte)(uVar1 >> 6) & 0x2f | 0x80;
            lVar5 = 4;
            lVar6 = 3;
          }
          else {
            if (iVar4 < 3) goto LAB_0013630f;
            *buf = (byte)(uVar1 >> 0xc) | 0xe0;
            ((byte *)buf)[1] = (byte)(uVar1 >> 6) & 0x3f | 0x80;
            lVar5 = 3;
            lVar6 = 2;
          }
LAB_00136341:
          ((byte *)buf)[lVar6] = (byte)uVar1 & 0x3f | 0x80;
        }
        buf = (char *)((byte *)buf + lVar5);
      }
      in_text = in_text + 1;
    } while (buf < pbVar3);
  }
  *buf = 0;
  return (int)buf - iVar2;
}

Assistant:

int ImTextStrToUtf8(char* buf, int buf_size, const ImWchar* in_text, const ImWchar* in_text_end)
{
    char* buf_out = buf;
    const char* buf_end = buf + buf_size;
    while (buf_out < buf_end-1 && (!in_text_end || in_text < in_text_end) && *in_text)
    {
        unsigned int c = (unsigned int)(*in_text++);
        if (c < 0x80)
            *buf_out++ = (char)c;
        else
            buf_out += ImTextCharToUtf8(buf_out, (int)(buf_end-buf_out-1), c);
    }
    *buf_out = 0;
    return (int)(buf_out - buf);
}